

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_cons_euler_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  int iVar2;
  REF_NODE pRVar3;
  uint uVar4;
  REF_DBL *scalar;
  REF_DBL *grad;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  REF_STATUS RVar15;
  REF_DBL *local_188;
  double *local_178;
  REF_DBL local_148 [4];
  REF_DBL state [5];
  REF_DBL dflux_dcons [25];
  
  pRVar3 = ref_grid->node;
  RVar15 = 2;
  iVar2 = pRVar3->max;
  lVar13 = (long)iVar2;
  if (lVar13 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xb8c,
           "ref_metric_cons_euler_g","malloc lam of REF_DBL negative");
    RVar15 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(lVar13 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar12 = "malloc lam of REF_DBL NULL";
      uVar11 = 0xb8c;
    }
    else {
      for (lVar8 = 0; lVar13 != lVar8; lVar8 = lVar8 + 1) {
        scalar[lVar8] = 0.0;
      }
      uVar5 = (ulong)(uint)(iVar2 * 3);
      grad = (REF_DBL *)malloc(uVar5 * 8);
      if (grad != (REF_DBL *)0x0) {
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          grad[uVar9] = 0.0;
        }
        local_188 = prim_dual + ldim / 2;
        local_178 = dflux_dcons;
        lVar13 = 0;
        while( true ) {
          if (lVar13 == 5) {
            free(grad);
            free(scalar);
            return 0;
          }
          uVar5 = (ulong)(uint)pRVar3->max;
          if (pRVar3->max < 1) {
            uVar5 = 0;
          }
          pRVar10 = local_188;
          for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
            if (-1 < pRVar3->global[uVar9]) {
              scalar[uVar9] = *pRVar10;
            }
            pRVar10 = pRVar10 + ldim;
          }
          uVar4 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
          if (uVar4 != 0) break;
          for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
            uVar5 = 0;
            pRVar10 = prim_dual;
            for (lVar14 = 0; lVar14 < pRVar3->max; lVar14 = lVar14 + 1) {
              if (-1 < pRVar3->global[lVar14]) {
                local_148[2] = 0.0;
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                local_148[lVar8] = 1.0;
                for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
                  state[lVar6] = pRVar10[lVar6];
                }
                uVar4 = ref_phys_euler_jac(state,local_148,dflux_dcons);
                if (uVar4 != 0) {
                  pcVar12 = "euler";
                  uVar11 = 0xb9e;
                  goto LAB_00191c3d;
                }
                dVar1 = grad[lVar8 + lVar14 * 3];
                pdVar7 = local_178;
                for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
                  g[uVar5 + lVar6] = *pdVar7 * dVar1 + g[uVar5 + lVar6];
                  pdVar7 = pdVar7 + 5;
                }
              }
              pRVar10 = pRVar10 + ldim;
              uVar5 = (ulong)((int)uVar5 + 5);
            }
          }
          lVar13 = lVar13 + 1;
          local_188 = local_188 + 1;
          local_178 = local_178 + 1;
        }
        pcVar12 = "grad_lam";
        uVar11 = 0xb94;
LAB_00191c3d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar11,"ref_metric_cons_euler_g",(ulong)uVar4,pcVar12);
        return uVar4;
      }
      pcVar12 = "malloc grad_lam of REF_DBL NULL";
      uVar11 = 0xb8d;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar11
           ,"ref_metric_cons_euler_g",pcVar12);
  }
  return RVar15;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_euler_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], dflux_dcons[25], direction[3];
  REF_DBL *lam, *grad_lam;
  REF_BOOL debug_export = REF_FALSE;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler_jac(state, direction, dflux_dcons), "euler");
        for (i = 0; i < 5; i++) {
          g[i + 5 * node] +=
              dflux_dcons[var + i * 5] * grad_lam[dir + 3 * node];
        }
      }
    }

    if (debug_export) {
      char filename[32];
      snprintf(filename, 32, "gradlam%d.tec", var);
      ref_gather_scalar_by_extension(ref_grid, 3, grad_lam, NULL, filename);
    }
  }
  ref_free(grad_lam);
  ref_free(lam);

  if (debug_export) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 5, g, NULL, "g.tec"),
        "dump g");
  }

  return REF_SUCCESS;
}